

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ImFontAtlas(ImFontAtlas *this)

{
  ImVec4 *local_48;
  ImFontAtlas *this_local;
  
  ImVec2::ImVec2(&this->TexUvScale);
  ImVec2::ImVec2(&this->TexUvWhitePixel);
  ImVector<ImFont_*>::ImVector(&this->Fonts);
  ImVector<ImFontAtlasCustomRect>::ImVector(&this->CustomRects);
  ImVector<ImFontConfig>::ImVector(&this->ConfigData);
  local_48 = this->TexUvLines;
  do {
    ImVec4::ImVec4(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (ImVec4 *)&this->FontBuilderIO);
  memset(this,0,0x490);
  this->TexGlyphPadding = 1;
  this->PackIdLines = -1;
  this->PackIdMouseCursors = -1;
  return;
}

Assistant:

ImFontAtlas::ImFontAtlas()
{
    memset(this, 0, sizeof(*this));
    TexGlyphPadding = 1;
    PackIdMouseCursors = PackIdLines = -1;
}